

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

qpdf_offset_t __thiscall QPDF::read_xrefTable(QPDF *this,qpdf_offset_t xref_offset)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  element_type *peVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QPDFExc *pQVar7;
  element_type *this_00;
  qpdf_offset_t qVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  longlong xref_offset_00;
  allocator<char> local_529;
  string local_528 [32];
  QPDFObjectHandle local_508;
  undefined1 local_4f2;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0 [32];
  QPDFObjectHandle local_480;
  allocator<char> local_469;
  string local_468;
  undefined1 local_442;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0 [32];
  QPDFObjectHandle local_3d0;
  allocator<char> local_3b9;
  string local_3b8 [32];
  QPDFObjectHandle local_398;
  allocator<char> local_381;
  string local_380;
  undefined1 local_35a;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308 [32];
  QPDFObjectHandle local_2e8;
  undefined1 local_2d2;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  QPDFObjectHandle local_260;
  undefined1 local_24a;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  undefined1 local_200 [8];
  QPDFObjectHandle cur_trailer;
  string local_1e8;
  Token local_1c8;
  undefined8 local_160;
  qpdf_offset_t pos;
  undefined1 local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  char local_bd;
  int local_bc;
  char type;
  qpdf_offset_t qStack_b8;
  int f2;
  qpdf_offset_t f1;
  qpdf_offset_t i;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  int local_58;
  int local_54;
  int bytes;
  int num;
  int obj;
  undefined1 local_40 [8];
  string line;
  qpdf_offset_t xref_offset_local;
  QPDF *this_local;
  
  line.field_2._8_8_ = xref_offset;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  (*peVar4->_vptr_InputSource[5])(peVar4,line.field_2._8_8_,0);
  std::__cxx11::string::string((string *)local_40);
  while( true ) {
    std::__cxx11::string::assign((ulong)local_40,'2');
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    uVar5 = std::__cxx11::string::data();
    uVar6 = std::__cxx11::string::size();
    (*peVar4->_vptr_InputSource[7])(peVar4,uVar5,uVar6);
    bytes = 0;
    local_54 = 0;
    local_58 = 0;
    bVar1 = parse_xrefFirst(this,(string *)local_40,&bytes,&local_54,&local_58);
    if (!bVar1) {
      QTC::TC("qpdf","QPDF invalid xref",0);
      i._6_1_ = 1;
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"xref table",&local_79)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"xref syntax invalid",(allocator<char> *)((long)&i + 7));
      damagedPDF(pQVar7,this,&local_78,&local_a0);
      i._6_1_ = 0;
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar3->file);
    qVar8 = InputSource::getLastOffset(this_00);
    (*peVar4->_vptr_InputSource[5])(peVar4,qVar8 + local_58,0);
    for (f1 = (qpdf_offset_t)bytes; f1 - local_54 < (long)bytes; f1 = f1 + 1) {
      if (f1 == 0) {
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&pMVar3->file);
        iVar2 = (*peVar4->_vptr_InputSource[4])();
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        pMVar3->first_xref_item_offset = CONCAT44(extraout_var,iVar2);
      }
      qStack_b8 = 0;
      local_bc = 0;
      local_bd = '\0';
      bVar1 = read_xrefEntry(this,&stack0xffffffffffffff48,&local_bc,&local_bd);
      if (!bVar1) {
        QTC::TC("qpdf","QPDF invalid xref entry",0);
        local_149 = 1;
        pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"xref table",&local_e1);
        std::__cxx11::to_string(&local_148,f1);
        std::operator+(&local_128,"invalid xref entry (obj=",&local_148);
        std::operator+(&local_108,&local_128,")");
        damagedPDF(pQVar7,this,&local_e0,&local_108);
        local_149 = 0;
        __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      if (local_bd == 'f') {
        iVar2 = toI<long_long>(&f1);
        QPDFObjGen::QPDFObjGen((QPDFObjGen *)((long)&pos + 4),iVar2,local_bc);
        insertFreeXrefEntry(this,stack0xfffffffffffffeac);
      }
      else {
        iVar2 = toI<long_long>(&f1);
        insertXrefEntry(this,iVar2,1,qStack_b8,local_bc);
      }
    }
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    iVar2 = (*peVar4->_vptr_InputSource[4])();
    local_160 = CONCAT44(extraout_var_00,iVar2);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar3->file);
    readToken(&local_1c8,this,peVar4,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"trailer",
               (allocator<char> *)
               ((long)&cur_trailer.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    bVar1 = QPDFTokenizer::Token::isWord(&local_1c8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&cur_trailer.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFTokenizer::Token::~Token(&local_1c8);
    if (bVar1) break;
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar3->file);
    (*peVar4->_vptr_InputSource[5])(peVar4,local_160,0);
  }
  readTrailer((QPDF *)local_200);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_200);
  if (!bVar1) {
    QTC::TC("qpdf","QPDF missing trailer",0);
    local_24a = 1;
    pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"expected trailer dictionary",&local_249);
    damagedPDF(pQVar7,this,&local_220,&local_248);
    local_24a = 0;
    __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool(&(pMVar3->trailer).super_BaseHandle);
  if (!bVar1) {
    QPDFObjectHandle::QPDFObjectHandle(&local_260,(QPDFObjectHandle *)local_200);
    setTrailer(this,&local_260);
    QPDFObjectHandle::~QPDFObjectHandle(&local_260);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"/Size",&local_281);
    bVar1 = QPDFObjectHandle::hasKey(&pMVar3->trailer,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QTC::TC("qpdf","QPDF trailer lacks size",0);
      local_2d2 = 1;
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"trailer",&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"trailer dictionary lacks /Size key",&local_2d1);
      damagedPDF(pQVar7,this,&local_2a8,&local_2d0);
      local_2d2 = 0;
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_308,"/Size",&local_309);
    QPDFObjectHandle::getKey(&local_2e8,(string *)&pMVar3->trailer);
    bVar1 = QPDFObjectHandle::isInteger(&local_2e8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_2e8);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator(&local_309);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QTC::TC("qpdf","QPDF trailer size not integer",0);
      local_35a = 1;
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"trailer",&local_331);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"/Size key in trailer dictionary is not an integer",&local_359
                );
      damagedPDF(pQVar7,this,&local_330,&local_358);
      local_35a = 0;
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"/XRefStm",&local_381);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_200,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  if (bVar1) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    if ((pMVar3->ignore_xref_streams & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3b8,"/XRefStm",&local_3b9);
      QPDFObjectHandle::getKey(&local_398,(string *)local_200);
      bVar1 = QPDFObjectHandle::isInteger(&local_398);
      QPDFObjectHandle::~QPDFObjectHandle(&local_398);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      if (!bVar1) {
        local_442 = 1;
        pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"xref stream",&local_419);
        uVar5 = line.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"invalid /XRefStm",&local_441);
        damagedPDF(pQVar7,this,&local_418,uVar5,&local_440);
        local_442 = 0;
        __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3f0,"/XRefStm",&local_3f1);
      QPDFObjectHandle::getKey(&local_3d0,(string *)local_200);
      xref_offset_00 = QPDFObjectHandle::getIntValue(&local_3d0);
      read_xrefStream(this,xref_offset_00);
      QPDFObjectHandle::~QPDFObjectHandle(&local_3d0);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
    }
    else {
      QTC::TC("qpdf","QPDF ignoring XRefStm in trailer",0);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"/Prev",&local_469);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_200,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4a0,"/Prev",&local_4a1);
    QPDFObjectHandle::getKey(&local_480,(string *)local_200);
    bVar1 = QPDFObjectHandle::isInteger(&local_480);
    QPDFObjectHandle::~QPDFObjectHandle(&local_480);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QTC::TC("qpdf","QPDF trailer prev not integer",0);
      local_4f2 = 1;
      pQVar7 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"trailer",&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,"/Prev key in trailer dictionary is not an integer",&local_4f1
                );
      damagedPDF(pQVar7,this,&local_4c8,&local_4f0);
      local_4f2 = 0;
      __cxa_throw(pQVar7,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QTC::TC("qpdf","QPDF prev key in trailer dictionary",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_528,"/Prev",&local_529);
    QPDFObjectHandle::getKey(&local_508,(string *)local_200);
    this_local = (QPDF *)QPDFObjectHandle::getIntValue(&local_508);
    QPDFObjectHandle::~QPDFObjectHandle(&local_508);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator(&local_529);
  }
  else {
    this_local = (QPDF *)0x0;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_200);
  std::__cxx11::string::~string((string *)local_40);
  return (qpdf_offset_t)this_local;
}

Assistant:

qpdf_offset_t
QPDF::read_xrefTable(qpdf_offset_t xref_offset)
{
    m->file->seek(xref_offset, SEEK_SET);
    std::string line;
    while (true) {
        line.assign(50, '\0');
        m->file->read(line.data(), line.size());
        int obj = 0;
        int num = 0;
        int bytes = 0;
        if (!parse_xrefFirst(line, obj, num, bytes)) {
            QTC::TC("qpdf", "QPDF invalid xref");
            throw damagedPDF("xref table", "xref syntax invalid");
        }
        m->file->seek(m->file->getLastOffset() + bytes, SEEK_SET);
        for (qpdf_offset_t i = obj; i - num < obj; ++i) {
            if (i == 0) {
                // This is needed by checkLinearization()
                m->first_xref_item_offset = m->file->tell();
            }
            // For xref_table, these will always be small enough to be ints
            qpdf_offset_t f1 = 0;
            int f2 = 0;
            char type = '\0';
            if (!read_xrefEntry(f1, f2, type)) {
                QTC::TC("qpdf", "QPDF invalid xref entry");
                throw damagedPDF(
                    "xref table", "invalid xref entry (obj=" + std::to_string(i) + ")");
            }
            if (type == 'f') {
                insertFreeXrefEntry(QPDFObjGen(toI(i), f2));
            } else {
                insertXrefEntry(toI(i), 1, f1, f2);
            }
        }
        qpdf_offset_t pos = m->file->tell();
        if (readToken(*m->file).isWord("trailer")) {
            break;
        } else {
            m->file->seek(pos, SEEK_SET);
        }
    }

    // Set offset to previous xref table if any
    QPDFObjectHandle cur_trailer = readTrailer();
    if (!cur_trailer.isDictionary()) {
        QTC::TC("qpdf", "QPDF missing trailer");
        throw damagedPDF("", "expected trailer dictionary");
    }

    if (!m->trailer) {
        setTrailer(cur_trailer);

        if (!m->trailer.hasKey("/Size")) {
            QTC::TC("qpdf", "QPDF trailer lacks size");
            throw damagedPDF("trailer", "trailer dictionary lacks /Size key");
        }
        if (!m->trailer.getKey("/Size").isInteger()) {
            QTC::TC("qpdf", "QPDF trailer size not integer");
            throw damagedPDF("trailer", "/Size key in trailer dictionary is not an integer");
        }
    }

    if (cur_trailer.hasKey("/XRefStm")) {
        if (m->ignore_xref_streams) {
            QTC::TC("qpdf", "QPDF ignoring XRefStm in trailer");
        } else {
            if (cur_trailer.getKey("/XRefStm").isInteger()) {
                // Read the xref stream but disregard any return value -- we'll use our trailer's
                // /Prev key instead of the xref stream's.
                (void)read_xrefStream(cur_trailer.getKey("/XRefStm").getIntValue());
            } else {
                throw damagedPDF("xref stream", xref_offset, "invalid /XRefStm");
            }
        }
    }

    if (cur_trailer.hasKey("/Prev")) {
        if (!cur_trailer.getKey("/Prev").isInteger()) {
            QTC::TC("qpdf", "QPDF trailer prev not integer");
            throw damagedPDF("trailer", "/Prev key in trailer dictionary is not an integer");
        }
        QTC::TC("qpdf", "QPDF prev key in trailer dictionary");
        return cur_trailer.getKey("/Prev").getIntValue();
    }

    return 0;
}